

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::SimpleFactory::getDisplayName
          (SimpleFactory *this,UnicodeString *id,Locale *param_2,UnicodeString *result)

{
  UBool UVar1;
  
  if (this->_visible != '\0') {
    UVar1 = UnicodeString::operator==(&this->_id,id);
    if (UVar1 != '\0') {
      UnicodeString::operator=(result,&this->_id);
      return result;
    }
  }
  UnicodeString::setToBogus(result);
  return result;
}

Assistant:

UnicodeString& 
SimpleFactory::getDisplayName(const UnicodeString& id, const Locale& /* locale */, UnicodeString& result) const 
{
    if (_visible && _id == id) {
        result = _id;
    } else {
        result.setToBogus();
    }
    return result;
}